

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  char *zStem;
  uint uVar10;
  short *psVar11;
  undefined4 in_register_00000034;
  char *pcVar12;
  undefined8 uVar13;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  ulong uVar14;
  int nBuf;
  int nStem;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint nStem_00;
  uint uVar18;
  size_t sStack_60;
  
  uVar14 = CONCAT44(in_register_0000008c,iEnd);
  uVar16 = CONCAT44(in_register_00000084,iStart);
  uVar17 = CONCAT44(in_register_00000034,tflags);
  if (nToken - 0x41U < 0xffffffc2) {
    uVar13 = *pCtx;
    UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
    uVar7 = (ulong)(uint)nToken;
    zStem = pToken;
    goto LAB_001d6fdf;
  }
  zStem = *(char **)((long)pCtx + 0x10);
  uVar17 = (ulong)(uint)nToken;
  memcpy(zStem,pToken,uVar17);
  if (zStem[nToken - 1U] == 's') {
    uVar7 = (ulong)(nToken - 2);
    if (zStem[uVar7] == 's') goto LAB_001d642f;
    if (zStem[uVar7] == 'e') {
      if ((uint)nToken < 5) {
        if (nToken == 4) goto LAB_001d643a;
        goto LAB_001d6442;
      }
      if ((zStem[uVar17 - 4] != 's') || (zStem[uVar17 - 3] != 's')) {
LAB_001d643a:
        if (zStem[uVar17 - 3] != 'i') goto LAB_001d6442;
      }
    }
    else {
LAB_001d6442:
      uVar7 = (ulong)(nToken - 1U);
    }
  }
  else {
LAB_001d642f:
    uVar7 = (ulong)(uint)nToken;
  }
  uVar10 = (uint)uVar7;
  uVar17 = (ulong)(uVar10 - 2);
  if (zStem[uVar17] == 'n') {
    if (3 < uVar10) {
      uVar17 = (ulong)(uVar10 - 3);
      iVar5 = bcmp("ing",zStem + uVar17,3);
      if (iVar5 == 0) {
LAB_001d64dc:
        uVar10 = (uint)uVar17;
        iVar5 = fts5Porter_Vowel(zStem,uVar10);
        if (iVar5 != 0) {
          pbVar8 = (byte *)(zStem + uVar17 + -2);
          bVar2 = *pbVar8;
          if (bVar2 == 0x69) {
            if ((2 < uVar10) && (*(short *)pbVar8 == 0x7a69)) {
              pcVar6 = "ize";
              goto LAB_001d65b2;
            }
          }
          else if (bVar2 == 0x62) {
            if ((2 < uVar10) && (*(short *)pbVar8 == 0x6c62)) {
              pcVar6 = "ble";
              goto LAB_001d65b2;
            }
          }
          else if (((bVar2 == 0x61) && (2 < uVar10)) && (*(short *)pbVar8 == 0x7461)) {
            pcVar6 = "ate";
LAB_001d65b2:
            zStem[uVar17] = pcVar6[2];
            *(undefined2 *)pbVar8 = *(undefined2 *)pcVar6;
            uVar7 = (ulong)(uVar10 + 1);
            goto LAB_001d65c2;
          }
          bVar3 = (zStem + uVar17)[-1];
          bVar9 = (byte)(bVar3 + 0x9f) >> 1 | (bVar3 + 0x9f) * -0x80;
          if ((((bVar9 < 0xb) && ((0x495U >> (bVar9 & 0x1f) & 1) != 0)) ||
              ((bVar3 - 0x6c < 0xf && ((0x4081U >> (bVar3 - 0x6c & 0x1f) & 1) != 0)))) ||
             (bVar3 != bVar2)) {
            iVar5 = fts5Porter_MEq1(zStem,uVar10);
            uVar7 = uVar17;
            if ((iVar5 != 0) && (iVar5 = fts5Porter_Ostar(zStem,uVar10), iVar5 != 0)) {
              uVar7 = (ulong)(uVar10 + 1);
              zStem[uVar17] = 'e';
            }
          }
          else {
            uVar7 = (ulong)(uVar10 - 1);
          }
        }
      }
    }
  }
  else if (zStem[uVar17] == 'e') {
    if (uVar10 < 4) {
      if (uVar10 == 3) goto LAB_001d64cd;
      uVar7 = 2;
    }
    else {
      pcVar6 = zStem + (uVar10 - 3);
      iVar5 = bcmp("eed",pcVar6,3);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 3);
        if (iVar5 != 0) {
          pcVar6[0] = 'e';
          pcVar6[1] = 'e';
          uVar7 = (ulong)(uVar10 - 1);
        }
      }
      else {
LAB_001d64cd:
        if (*(short *)(zStem + uVar17) == 0x6465) goto LAB_001d64dc;
      }
    }
  }
LAB_001d65c2:
  uVar10 = (uint)uVar7;
  uVar17 = (long)(int)uVar10 - 1;
  if ((zStem[(long)(int)uVar10 + -1] == 'y') &&
     (iVar5 = fts5Porter_Vowel(zStem,(int)uVar17), iVar5 != 0)) {
    zStem[uVar7 - 1] = 'i';
  }
  switch(zStem[uVar7 - 2]) {
  case 'a':
    if (uVar10 < 8) {
      if (uVar10 == 7) goto LAB_001d6965;
    }
    else {
      pcVar6 = zStem + (uVar10 - 7);
      iVar5 = bcmp("ational",pcVar6,7);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 7);
        if (iVar5 != 0) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'a';
          pcVar6[1] = 't';
          goto LAB_001d6b8b;
        }
      }
      else {
LAB_001d6965:
        uVar18 = uVar10 - 6;
        iVar5 = bcmp("tional",zStem + uVar18,6);
        if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
          builtin_strncpy(zStem + uVar18,"tion",4);
          goto LAB_001d6b6c;
        }
      }
    }
    break;
  case 'c':
    if (4 < uVar10) {
      uVar10 = uVar10 - 4;
      piVar1 = (int *)(zStem + uVar10);
      if (*(int *)(zStem + uVar10) == 0x69636e65) {
        iVar5 = fts5Porter_MGt0(zStem,uVar10);
        if (iVar5 != 0) {
          *piVar1 = 0x65636e65;
        }
      }
      else if ((*piVar1 == 0x69636e61) && (iVar5 = fts5Porter_MGt0(zStem,uVar10), iVar5 != 0)) {
        *piVar1 = 0x65636e61;
      }
    }
    break;
  case 'e':
    if (4 < uVar10) {
      uVar10 = uVar10 - 4;
      if ((*(int *)(zStem + uVar10) == 0x72657a69) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar10), iVar5 != 0)) {
        pcVar6 = zStem + uVar10;
        pcVar6[2] = 'e';
        pcVar6[0] = 'i';
        pcVar6[1] = 'z';
LAB_001d69e2:
        uVar7 = uVar17 & 0xffffffff;
      }
    }
    break;
  case 'g':
    if (4 < uVar10) {
      uVar10 = uVar10 - 4;
      if ((*(int *)(zStem + uVar10) == 0x69676f6c) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar10), iVar5 != 0)) {
        pcVar6 = zStem + uVar10;
        pcVar6[2] = 'g';
        pcVar6[0] = 'l';
        pcVar6[1] = 'o';
        goto LAB_001d69e2;
      }
    }
    break;
  case 'l':
    if (3 < uVar10) {
      uVar18 = uVar10 - 3;
      pcVar6 = zStem + uVar18;
      iVar5 = bcmp("bli",pcVar6,3);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar18);
        if (iVar5 != 0) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'b';
          pcVar6[1] = 'l';
        }
      }
      else {
        if (uVar10 == 4) {
LAB_001d69ea:
          bVar4 = false;
        }
        else {
          nStem_00 = uVar10 - 4;
          if (*(int *)(zStem + nStem_00) == 0x696c6c61) {
            iVar5 = fts5Porter_MGt0(zStem,nStem_00);
            if (iVar5 == 0) break;
            (zStem + nStem_00)[0] = 'a';
            (zStem + nStem_00)[1] = 'l';
            goto LAB_001d6b6c;
          }
          if (uVar10 < 6) goto LAB_001d69ea;
          pcVar12 = zStem + (uVar10 - 5);
          iVar5 = bcmp("entli",pcVar12,5);
          bVar4 = true;
          if (iVar5 == 0) {
            iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5);
            if (iVar5 != 0) {
              pcVar12[2] = 't';
              pcVar12[0] = 'e';
              pcVar12[1] = 'n';
              goto LAB_001d6b6c;
            }
            break;
          }
        }
        iVar5 = bcmp("eli",pcVar6,3);
        if (iVar5 == 0) {
          iVar5 = fts5Porter_MGt0(zStem,uVar18);
          if (iVar5 != 0) {
            *pcVar6 = 'e';
LAB_001d6b6c:
            uVar7 = (ulong)(uVar10 - 2);
          }
        }
        else if (bVar4) {
          pcVar6 = zStem + (uVar10 - 5);
          iVar5 = bcmp("ousli",pcVar6,5);
          if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5), iVar5 != 0)) {
            pcVar6[2] = 's';
            pcVar6[0] = 'o';
            pcVar6[1] = 'u';
            goto LAB_001d6b6c;
          }
        }
      }
    }
    break;
  case 'o':
    if (uVar10 < 8) {
      if (5 < uVar10) goto LAB_001d691c;
      if (uVar10 != 5) break;
LAB_001d69b0:
      uVar10 = uVar10 - 4;
      if ((*(int *)(zStem + uVar10) == 0x726f7461) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar10), iVar5 != 0)) {
        pcVar6 = zStem + uVar10;
        pcVar6[2] = 'e';
        pcVar6[0] = 'a';
        pcVar6[1] = 't';
        goto LAB_001d69e2;
      }
    }
    else {
      pcVar6 = zStem + (uVar10 - 7);
      iVar5 = bcmp("ization",pcVar6,7);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 7);
        if (iVar5 != 0) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'i';
          pcVar6[1] = 'z';
          goto LAB_001d6b8b;
        }
      }
      else {
LAB_001d691c:
        pcVar6 = zStem + (uVar10 - 5);
        iVar5 = bcmp("ation",pcVar6,5);
        if (iVar5 != 0) goto LAB_001d69b0;
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5);
        if (iVar5 != 0) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'a';
          pcVar6[1] = 't';
          goto LAB_001d6b6c;
        }
      }
    }
    break;
  case 's':
    if (5 < uVar10) {
      pcVar6 = zStem + (uVar10 - 5);
      iVar5 = bcmp("alism",pcVar6,5);
      if (iVar5 == 0) {
LAB_001d6a7f:
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5);
        if (iVar5 != 0) {
          pcVar6[0] = 'a';
          pcVar6[1] = 'l';
LAB_001d6a93:
          uVar7 = (ulong)(uVar10 - 3);
        }
      }
      else if (7 < uVar10) {
        uVar18 = uVar10 - 7;
        pcVar6 = zStem + uVar18;
        iVar5 = bcmp("iveness",pcVar6,7);
        if (iVar5 == 0) {
          iVar5 = fts5Porter_MGt0(zStem,uVar18);
          if (iVar5 != 0) {
            pcVar6[2] = 'e';
            pcVar6[0] = 'i';
            pcVar6[1] = 'v';
            goto LAB_001d6b8b;
          }
        }
        else {
          iVar5 = bcmp("fulness",pcVar6,7);
          if (iVar5 == 0) {
            iVar5 = fts5Porter_MGt0(zStem,uVar18);
            if (iVar5 != 0) {
              pcVar6[2] = 'l';
              pcVar6[0] = 'f';
              pcVar6[1] = 'u';
              goto LAB_001d6b8b;
            }
          }
          else {
            iVar5 = bcmp("ousness",pcVar6,7);
            if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
              pcVar6[2] = 's';
              pcVar6[0] = 'o';
              pcVar6[1] = 'u';
LAB_001d6b8b:
              uVar7 = (ulong)(uVar10 - 4);
            }
          }
        }
      }
    }
    break;
  case 't':
    if (5 < uVar10) {
      pcVar6 = zStem + (uVar10 - 5);
      iVar5 = bcmp("aliti",pcVar6,5);
      if (iVar5 == 0) goto LAB_001d6a7f;
      iVar5 = bcmp("iviti",pcVar6,5);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5);
        if (iVar5 != 0) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'i';
          pcVar6[1] = 'v';
          goto LAB_001d6b6c;
        }
      }
      else if (uVar10 == 6) {
        uVar7 = 6;
      }
      else {
        pcVar6 = zStem + (uVar10 - 6);
        iVar5 = bcmp("biliti",pcVar6,6);
        if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar10 - 6), iVar5 != 0)) {
          pcVar6[2] = 'e';
          pcVar6[0] = 'b';
          pcVar6[1] = 'l';
          goto LAB_001d6a93;
        }
      }
    }
  }
  uVar10 = (uint)uVar7;
  switch(zStem[uVar7 - 2]) {
  case 's':
    if ((4 < uVar10) && (uVar17 = (ulong)(uVar10 - 4), *(int *)(zStem + uVar17) == 0x7373656e)) {
LAB_001d6cf3:
      iVar5 = fts5Porter_MGt0(zStem,(int)uVar17);
      if (iVar5 != 0) {
LAB_001d6d02:
        uVar7 = uVar17;
      }
    }
    break;
  case 't':
    if (5 < uVar10) {
      pcVar6 = zStem + (uVar10 - 5);
      iVar5 = bcmp("icate",pcVar6,5);
      if (((iVar5 == 0) || (iVar5 = bcmp("iciti",pcVar6,5), iVar5 == 0)) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5), iVar5 != 0)) {
        pcVar6[0] = 'i';
        pcVar6[1] = 'c';
LAB_001d6ccb:
        uVar10 = uVar10 - 3;
LAB_001d6cce:
        uVar17 = (ulong)uVar10;
        goto LAB_001d6d02;
      }
    }
    break;
  case 'u':
    if (3 < uVar10) {
      uVar10 = uVar10 - 3;
      pcVar6 = "ful";
      sStack_60 = 3;
LAB_001d6ce9:
      uVar17 = (ulong)uVar10;
      iVar5 = bcmp(pcVar6,zStem + uVar17,sStack_60);
      if (iVar5 == 0) goto LAB_001d6cf3;
    }
    break;
  case 'v':
    if (5 < uVar10) {
      uVar10 = uVar10 - 5;
      pcVar6 = "ative";
      sStack_60 = 5;
      goto LAB_001d6ce9;
    }
    break;
  case 'w':
  case 'x':
  case 'y':
    break;
  case 'z':
    if (5 < uVar10) {
      pcVar6 = zStem + (uVar10 - 5);
      iVar5 = bcmp("alize",pcVar6,5);
      if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar10 - 5), iVar5 != 0)) {
        pcVar6[0] = 'a';
        pcVar6[1] = 'l';
        goto LAB_001d6ccb;
      }
    }
    break;
  default:
    if ((zStem[uVar7 - 2] == 'a') && (4 < uVar10)) {
      uVar18 = uVar10 - 4;
      if ((*(int *)(zStem + uVar18) == 0x6c616369) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
        uVar10 = uVar10 - 2;
        goto LAB_001d6cce;
      }
    }
  }
  uVar10 = (uint)uVar7;
  lVar15 = (long)(int)uVar10;
  if ((byte)zStem[lVar15 + -2] - 0x61 < 0x1a) {
    psVar11 = (short *)(zStem + lVar15 + -2);
    uVar16 = lVar15 - 2;
    uVar17 = uVar16;
    switch((uint)(byte)zStem[lVar15 + -2]) {
    case 0x61:
      if ((2 < uVar10) && (*psVar11 == 0x6c61)) {
LAB_001d6f68:
        iVar5 = fts5Porter_MGt1(zStem,(int)uVar17);
LAB_001d6f73:
        if (iVar5 != 0) {
          uVar7 = uVar17 & 0xffffffff;
        }
      }
      break;
    case 99:
      if ((4 < uVar10) &&
         ((uVar17 = (ulong)(uVar10 - 4), *(int *)(zStem + uVar17) == 0x65636e61 ||
          (*(int *)(zStem + uVar17) == 0x65636e65)))) goto LAB_001d6f68;
      break;
    case 0x65:
      if ((2 < uVar10) && (*psVar11 == 0x7265)) goto LAB_001d6f68;
      break;
    case 0x69:
      if ((2 < uVar10) && (*psVar11 == 0x6369)) goto LAB_001d6f68;
      break;
    case 0x6c:
      if ((4 < uVar10) &&
         ((uVar17 = (ulong)(uVar10 - 4), *(int *)(zStem + uVar17) == 0x656c6261 ||
          (*(int *)(zStem + uVar17) == 0x656c6269)))) goto LAB_001d6f68;
      break;
    case 0x6e:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        iVar5 = bcmp("ant",pcVar6,3);
        uVar17 = uVar16;
        if (iVar5 == 0) goto LAB_001d6f68;
        if (5 < uVar10) {
          uVar17 = (ulong)(uVar10 - 5);
          iVar5 = bcmp("ement",zStem + uVar17,5);
          if (iVar5 != 0) goto LAB_001d6f40;
LAB_001d700f:
          iVar5 = fts5Porter_MGt1(zStem,(int)uVar17);
          goto LAB_001d6f73;
        }
        if (uVar10 != 4) {
LAB_001d6f40:
          uVar17 = (ulong)(uVar10 - 4);
          if (*(int *)(zStem + uVar17) == 0x746e656d) goto LAB_001d700f;
        }
        pcVar12 = "ent";
LAB_001d6f5f:
        iVar5 = bcmp(pcVar12,pcVar6,3);
        uVar17 = uVar16;
        if (iVar5 == 0) goto LAB_001d6f68;
      }
      break;
    case 0x6f:
      if (uVar10 < 4) {
        if (uVar10 == 3) goto LAB_001d6f31;
      }
      else {
        uVar17 = (ulong)(uVar10 - 3);
        iVar5 = bcmp("ion",zStem + uVar17,3);
        if (iVar5 == 0) {
          if (1 < (byte)((zStem + uVar17)[-1] + 0x8dU)) break;
          iVar5 = fts5Porter_MGt1(zStem,uVar10 - 3);
          goto LAB_001d6f73;
        }
LAB_001d6f31:
        uVar17 = uVar16;
        if (*psVar11 == 0x756f) goto LAB_001d6f68;
      }
      break;
    case 0x73:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        pcVar12 = "ism";
        goto LAB_001d6f5f;
      }
      break;
    case 0x74:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        iVar5 = bcmp("ate",pcVar6,3);
        uVar17 = uVar16;
        if (iVar5 != 0) {
          pcVar12 = "iti";
          goto LAB_001d6f5f;
        }
        goto LAB_001d6f68;
      }
      break;
    case 0x75:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        pcVar12 = "ous";
        goto LAB_001d6f5f;
      }
      break;
    case 0x76:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        pcVar12 = "ive";
        goto LAB_001d6f5f;
      }
      break;
    case 0x7a:
      if (3 < uVar10) {
        uVar16 = (ulong)(uVar10 - 3);
        pcVar6 = zStem + uVar16;
        pcVar12 = "ize";
        goto LAB_001d6f5f;
      }
    }
  }
  if (zStem[(long)(int)uVar7 + -1] == 'e') {
    uVar17 = (long)(int)uVar7 - 1;
    nStem = (int)uVar17;
    iVar5 = fts5Porter_MGt1(zStem,nStem);
    if ((iVar5 != 0) ||
       ((iVar5 = fts5Porter_MEq1(zStem,nStem), iVar5 != 0 &&
        (iVar5 = fts5Porter_Ostar(zStem,nStem), iVar5 == 0)))) {
      uVar7 = uVar17 & 0xffffffff;
    }
  }
  if ((((1 < (int)uVar7) && (uVar10 = (int)uVar7 - 1, zStem[uVar10] == 'l')) &&
      (zStem[uVar7 - 2] == 'l')) && (iVar5 = fts5Porter_MGt1(zStem,uVar10), iVar5 != 0)) {
    uVar7 = (ulong)uVar10;
  }
  uVar13 = *pCtx;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
  uVar17 = (ulong)(uint)tflags;
  uVar16 = (ulong)(uint)iStart;
  uVar14 = (ulong)(uint)iEnd;
LAB_001d6fdf:
  iVar5 = (*UNRECOVERED_JUMPTABLE)(uVar13,uVar17,zStem,uVar7,uVar16,uVar14);
  return iVar5;
}

Assistant:

static int fts5PorterCb(
  void *pCtx,
  int tflags,
  const char *pToken,
  int nToken,
  int iStart,
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2]
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1)
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l'
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1)
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}